

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tls-server.c
# Opt level: O1

void lws_sul_tls_cb(lws_sorted_usec_list_t *sul)

{
  lws_usec_t lVar1;
  
  lws_tls_check_all_cert_lifetimes((lws_context *)sul[2].cb);
  lVar1 = lws_now_usecs();
  sul->us = lVar1 + 86400000000;
  __lws_sul_insert((lws_dll2_owner_t *)(sul + -2),sul);
  return;
}

Assistant:

static void
lws_sul_tls_cb(lws_sorted_usec_list_t *sul)
{
	struct lws_context_per_thread *pt = lws_container_of(sul,
			struct lws_context_per_thread, sul_tls);

	lws_tls_check_all_cert_lifetimes(pt->context);

	__lws_sul_insert_us(&pt->pt_sul_owner[LWSSULLI_MISS_IF_SUSPENDED],
			    &pt->sul_tls,
			    (lws_usec_t)24 * 3600 * LWS_US_PER_SEC);
}